

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

size_t __thiscall caffe::ConcatParameter::ByteSizeLong(ConcatParameter *this)

{
  bool bVar1;
  uint32 value;
  int32 value_00;
  int iVar2;
  UnknownFieldSet *unknown_fields;
  size_t sVar3;
  size_t sStack_38;
  int cached_size;
  size_t total_size;
  ConcatParameter *this_local;
  
  sStack_38 = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = ConcatParameter::unknown_fields(this);
    sStack_38 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  if (((this->_has_bits_).has_bits_[0] & 3) != 0) {
    bVar1 = has_concat_dim(this);
    if (bVar1) {
      value = concat_dim(this);
      sVar3 = google::protobuf::internal::WireFormatLite::UInt32Size(value);
      sStack_38 = sVar3 + 1 + sStack_38;
    }
    bVar1 = has_axis(this);
    if (bVar1) {
      value_00 = axis(this);
      sVar3 = google::protobuf::internal::WireFormatLite::Int32Size(value_00);
      sStack_38 = sVar3 + 1 + sStack_38;
    }
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_38);
  this->_cached_size_ = iVar2;
  return sStack_38;
}

Assistant:

size_t ConcatParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.ConcatParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 3u) {
    // optional uint32 concat_dim = 1 [default = 1];
    if (has_concat_dim()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->concat_dim());
    }

    // optional int32 axis = 2 [default = 1];
    if (has_axis()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->axis());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}